

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

bdecode_node * __thiscall
libtorrent::dht_direct_response_alert::response
          (bdecode_node *__return_storage_ptr__,dht_direct_response_alert *this)

{
  int iVar1;
  vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  *pvVar2;
  char *start;
  error_code ec;
  
  if (this->m_response_size == 0) {
    __return_storage_ptr__->m_last_index = 0;
    __return_storage_ptr__->m_last_token = 0;
    __return_storage_ptr__->m_size = 0;
    *(undefined4 *)&__return_storage_ptr__->field_0x3c = 0;
    __return_storage_ptr__->m_buffer = (char *)0x0;
    __return_storage_ptr__->m_buffer_size = 0;
    __return_storage_ptr__->m_token_idx = 0;
    *(undefined1 (*) [16])
     &(__return_storage_ptr__->m_tokens).
      super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      .
      super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    pvVar2 = &(__return_storage_ptr__->m_tokens).
              super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    ;
    (pvVar2->
    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar2->
    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __return_storage_ptr__->m_token_idx = -1;
    __return_storage_ptr__->m_last_index = -1;
    __return_storage_ptr__->m_last_token = -1;
    __return_storage_ptr__->m_size = -1;
  }
  else {
    start = aux::stack_allocator::ptr
                      ((this->m_alloc)._M_data,(allocation_slot)(this->m_response_idx).m_idx);
    iVar1 = this->m_response_size;
    ec.val_ = 0;
    ec.failed_ = false;
    ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
               super_error_category;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->m_root_tokens + 4) = (undefined1  [16])0x0
    ;
    *(undefined1 (*) [16])
     &(__return_storage_ptr__->m_tokens).
      super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      .
      super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    pvVar2 = &(__return_storage_ptr__->m_tokens).
              super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    ;
    (pvVar2->
    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar2->
    super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __return_storage_ptr__->m_token_idx = -1;
    __return_storage_ptr__->m_last_index = -1;
    __return_storage_ptr__->m_last_token = -1;
    __return_storage_ptr__->m_size = -1;
    bdecode(start,start + iVar1,__return_storage_ptr__,&ec,(int *)0x0,100,2000000);
  }
  return __return_storage_ptr__;
}

Assistant:

bdecode_node dht_direct_response_alert::response() const
	{
		if (m_response_size == 0) return bdecode_node();
		char const* start = m_alloc.get().ptr(m_response_idx);
		char const* end = start + m_response_size;
		error_code ec;
		bdecode_node ret;
		bdecode(start, end, ret, ec);
		TORRENT_ASSERT(!ec);
		return ret;
	}